

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

bool __thiscall
cbtQuantizedBvh::serialize
          (cbtQuantizedBvh *this,void *o_alignedDataBuffer,uint param_2,bool i_swapEndian)

{
  void *buffer;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  uint uVar5;
  cbtQuantizedBvhNode *pcVar6;
  cbtOptimizedBvhNode *pcVar7;
  cbtBvhSubtreeInfo *pcVar8;
  undefined8 uVar9;
  int i;
  int iVar10;
  long lVar11;
  undefined7 in_register_00000009;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  cbtQuantizedBvh((cbtQuantizedBvh *)o_alignedDataBuffer);
  if ((int)CONCAT71(in_register_00000009,i_swapEndian) == 0) {
    *(int *)((long)o_alignedDataBuffer + 0x3c) = this->m_curNodeIndex;
    uVar9 = *(undefined8 *)((this->m_bvhAabbMin).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 8) = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x10) = uVar9;
    uVar9 = *(undefined8 *)((this->m_bvhAabbMax).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x18) = *(undefined8 *)(this->m_bvhAabbMax).m_floats
    ;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x20) = uVar9;
    uVar9 = *(undefined8 *)((this->m_bvhQuantization).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x28) =
         *(undefined8 *)(this->m_bvhQuantization).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x30) = uVar9;
    *(cbtTraversalMode *)((long)o_alignedDataBuffer + 200) = this->m_traversalMode;
    iVar10 = this->m_subtreeHeaderCount;
  }
  else {
    uVar4 = swap_bytes(this->m_curNodeIndex);
    *(undefined4 *)((long)o_alignedDataBuffer + 0x3c) = uVar4;
    lVar11 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 8) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar11 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 9) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar11 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 10) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar11 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0xb) =
           *(undefined1 *)((this->m_bvhAabbMin).m_floats + lVar11);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lVar11 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0x18) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar11 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0x19) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar11 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0x1a) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar11 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0x1b) =
           *(undefined1 *)((this->m_bvhAabbMax).m_floats + lVar11);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lVar11 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0x28) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar11 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0x29) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar11 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0x2a) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar11 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar11 * 4 + 0x2b) =
           *(undefined1 *)((this->m_bvhQuantization).m_floats + lVar11);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    uVar4 = swap_bytes(this->m_traversalMode);
    *(undefined4 *)((long)o_alignedDataBuffer + 200) = uVar4;
    iVar10 = swap_bytes(this->m_subtreeHeaderCount);
  }
  *(int *)((long)o_alignedDataBuffer + 0xf0) = iVar10;
  *(bool *)((long)o_alignedDataBuffer + 0x40) = this->m_useQuantization;
  buffer = (void *)((long)o_alignedDataBuffer + 0xf8);
  uVar5 = this->m_curNodeIndex;
  uVar16 = (ulong)uVar5;
  if (this->m_useQuantization == true) {
    cbtAlignedObjectArray<cbtQuantizedBvhNode>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtQuantizedBvhNode> *)((long)o_alignedDataBuffer + 0xa8),
               buffer,uVar5,uVar5);
    if (i_swapEndian) {
      if (0 < (int)uVar5) {
        pcVar6 = (this->m_quantizedContiguousNodes).m_data;
        lVar11 = *(long *)((long)o_alignedDataBuffer + 0xb8);
        lVar12 = 0;
        do {
          uVar3 = swap_bytes(*(undefined2 *)((long)pcVar6->m_quantizedAabbMin + lVar12));
          *(undefined2 *)(lVar11 + lVar12) = uVar3;
          uVar3 = swap_bytes(*(undefined2 *)((long)pcVar6->m_quantizedAabbMin + lVar12 + 2));
          *(undefined2 *)(lVar11 + 2 + lVar12) = uVar3;
          uVar3 = swap_bytes(*(undefined2 *)((long)pcVar6->m_quantizedAabbMin + lVar12 + 4));
          *(undefined2 *)(lVar11 + 4 + lVar12) = uVar3;
          uVar3 = swap_bytes(*(undefined2 *)((long)pcVar6->m_quantizedAabbMax + lVar12));
          *(undefined2 *)(lVar11 + 6 + lVar12) = uVar3;
          uVar3 = swap_bytes(*(undefined2 *)((long)pcVar6->m_quantizedAabbMax + lVar12 + 2));
          *(undefined2 *)(lVar11 + 8 + lVar12) = uVar3;
          uVar3 = swap_bytes(*(undefined2 *)((long)pcVar6->m_quantizedAabbMax + lVar12 + 4));
          *(undefined2 *)(lVar11 + 10 + lVar12) = uVar3;
          uVar4 = swap_bytes(*(undefined4 *)((long)pcVar6->m_quantizedAabbMax + lVar12 + 6));
          *(undefined4 *)(lVar11 + 0xc + lVar12) = uVar4;
          lVar12 = lVar12 + 0x10;
        } while (uVar16 << 4 != lVar12);
      }
    }
    else if (0 < (int)uVar5) {
      pcVar6 = (this->m_quantizedContiguousNodes).m_data;
      lVar11 = *(long *)((long)o_alignedDataBuffer + 0xb8);
      lVar12 = 0;
      do {
        *(undefined2 *)(lVar11 + lVar12) =
             *(undefined2 *)((long)pcVar6->m_quantizedAabbMin + lVar12);
        *(undefined2 *)(lVar11 + 2 + lVar12) =
             *(undefined2 *)((long)pcVar6->m_quantizedAabbMin + lVar12 + 2);
        *(undefined2 *)(lVar11 + 4 + lVar12) =
             *(undefined2 *)((long)pcVar6->m_quantizedAabbMin + lVar12 + 4);
        *(undefined2 *)(lVar11 + 6 + lVar12) =
             *(undefined2 *)((long)pcVar6->m_quantizedAabbMax + lVar12);
        *(undefined2 *)(lVar11 + 8 + lVar12) =
             *(undefined2 *)((long)pcVar6->m_quantizedAabbMax + lVar12 + 2);
        *(undefined2 *)(lVar11 + 10 + lVar12) =
             *(undefined2 *)((long)pcVar6->m_quantizedAabbMax + lVar12 + 4);
        *(undefined4 *)(lVar11 + 0xc + lVar12) =
             *(undefined4 *)((long)pcVar6->m_quantizedAabbMax + lVar12 + 6);
        lVar12 = lVar12 + 0x10;
      } while (uVar16 << 4 != lVar12);
    }
    lVar11 = (long)(int)uVar5 << 4;
    cbtAlignedObjectArray<cbtQuantizedBvhNode>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtQuantizedBvhNode> *)((long)o_alignedDataBuffer + 0xa8),
               (void *)0x0,0,0);
  }
  else {
    cbtAlignedObjectArray<cbtOptimizedBvhNode>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtOptimizedBvhNode> *)((long)o_alignedDataBuffer + 0x68),
               buffer,uVar5,uVar5);
    if (i_swapEndian) {
      if (0 < (int)uVar5) {
        lVar11 = 3;
        lVar12 = 0x13;
        uVar13 = 0;
        do {
          lVar14 = *(long *)((long)o_alignedDataBuffer + 0x78) + lVar11;
          pcVar7 = (this->m_contiguousNodes).m_data;
          lVar15 = 0;
          do {
            *(undefined1 *)(lVar14 + -3 + lVar15 * 4) =
                 *(undefined1 *)((long)(pcVar7->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar11);
            *(undefined1 *)(lVar14 + -2 + lVar15 * 4) =
                 *(undefined1 *)((long)(pcVar7->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar11 + -1);
            *(undefined1 *)(lVar14 + -1 + lVar15 * 4) =
                 *(undefined1 *)((long)(pcVar7->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar11 + -2);
            *(undefined1 *)(lVar14 + lVar15 * 4) =
                 *(undefined1 *)((long)(pcVar7->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar11 + -3);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          lVar14 = *(long *)((long)o_alignedDataBuffer + 0x78) + lVar12;
          pcVar7 = (this->m_contiguousNodes).m_data;
          lVar15 = 0;
          do {
            *(undefined1 *)(lVar14 + -3 + lVar15 * 4) =
                 *(undefined1 *)((long)(pcVar7->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar12);
            *(undefined1 *)(lVar14 + -2 + lVar15 * 4) =
                 *(undefined1 *)((long)(pcVar7->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar12 + -1);
            *(undefined1 *)(lVar14 + -1 + lVar15 * 4) =
                 *(undefined1 *)((long)(pcVar7->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar12 + -2);
            *(undefined1 *)(lVar14 + lVar15 * 4) =
                 *(undefined1 *)((long)(pcVar7->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar12 + -3);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          pcVar7 = (this->m_contiguousNodes).m_data;
          lVar15 = uVar13 * 0x40;
          lVar14 = *(long *)((long)o_alignedDataBuffer + 0x78);
          uVar4 = swap_bytes(pcVar7[uVar13].m_escapeIndex);
          *(undefined4 *)(lVar14 + 0x20 + lVar15) = uVar4;
          uVar4 = swap_bytes(pcVar7[uVar13].m_subPart);
          *(undefined4 *)(lVar14 + 0x24 + lVar15) = uVar4;
          uVar4 = swap_bytes(pcVar7[uVar13].m_triangleIndex);
          *(undefined4 *)(lVar14 + 0x28 + lVar15) = uVar4;
          uVar13 = uVar13 + 1;
          lVar11 = lVar11 + 0x40;
          lVar12 = lVar12 + 0x40;
        } while (uVar13 != uVar16);
      }
    }
    else if (0 < (int)uVar5) {
      lVar11 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar11);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)(*(long *)((long)o_alignedDataBuffer + 0x78) + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + lVar11);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)(*(long *)((long)o_alignedDataBuffer + 0x78) + 0x10 + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        pcVar7 = (this->m_contiguousNodes).m_data;
        lVar12 = *(long *)((long)o_alignedDataBuffer + 0x78);
        *(undefined4 *)(lVar12 + 0x20 + lVar11) = *(undefined4 *)(pcVar7->m_padding + lVar11 + -0xc)
        ;
        *(undefined4 *)(lVar12 + 0x24 + lVar11) = *(undefined4 *)(pcVar7->m_padding + lVar11 + -8);
        *(undefined4 *)(lVar12 + 0x28 + lVar11) = *(undefined4 *)(pcVar7->m_padding + lVar11 + -4);
        lVar11 = lVar11 + 0x40;
      } while (uVar16 << 6 != lVar11);
    }
    lVar11 = (long)(int)uVar5 << 6;
    cbtAlignedObjectArray<cbtOptimizedBvhNode>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtOptimizedBvhNode> *)((long)o_alignedDataBuffer + 0x68),
               (void *)0x0,0,0);
  }
  cbtAlignedObjectArray<cbtBvhSubtreeInfo>::initializeFromBuffer
            ((cbtAlignedObjectArray<cbtBvhSubtreeInfo> *)((long)o_alignedDataBuffer + 0xd0),
             (void *)((long)buffer + lVar11),this->m_subtreeHeaderCount,this->m_subtreeHeaderCount);
  uVar5 = this->m_subtreeHeaderCount;
  if (i_swapEndian) {
    if (0 < (int)uVar5) {
      pcVar8 = (this->m_SubtreeHeaders).m_data;
      lVar11 = *(long *)((long)o_alignedDataBuffer + 0xe0);
      lVar12 = 0;
      do {
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12));
        *(undefined2 *)(lVar11 + lVar12) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + 2));
        *(undefined2 *)(lVar11 + 2 + lVar12) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + 4));
        *(undefined2 *)(lVar11 + 4 + lVar12) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar8->m_quantizedAabbMax + lVar12));
        *(undefined2 *)(lVar11 + 6 + lVar12) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar8->m_quantizedAabbMax + lVar12 + 2));
        *(undefined2 *)(lVar11 + 8 + lVar12) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar8->m_quantizedAabbMax + lVar12 + 4));
        *(undefined2 *)(lVar11 + 10 + lVar12) = uVar3;
        uVar4 = swap_bytes(*(undefined4 *)((long)pcVar8->m_quantizedAabbMax + lVar12 + 6));
        *(undefined4 *)(lVar11 + 0xc + lVar12) = uVar4;
        uVar4 = swap_bytes(*(undefined4 *)((long)pcVar8->m_padding + lVar12 + -4));
        *(undefined4 *)(lVar11 + 0x10 + lVar12) = uVar4;
        lVar12 = lVar12 + 0x20;
      } while ((ulong)uVar5 << 5 != lVar12);
    }
  }
  else if (0 < (int)uVar5) {
    pcVar8 = (this->m_SubtreeHeaders).m_data;
    lVar11 = *(long *)((long)o_alignedDataBuffer + 0xe0);
    lVar12 = 0x10;
    lVar14 = 0;
    do {
      *(undefined2 *)(lVar11 + -0x10 + lVar12) =
           *(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + -0x10);
      *(undefined2 *)(lVar11 + -0xe + lVar12) =
           *(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + -0xe);
      *(undefined2 *)(lVar11 + -0xc + lVar12) =
           *(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + -0xc);
      *(undefined2 *)(lVar11 + -10 + lVar12) =
           *(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + -10);
      *(undefined2 *)(lVar11 + -8 + lVar12) =
           *(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + -8);
      *(undefined2 *)(lVar11 + -6 + lVar12) =
           *(undefined2 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + -6);
      *(undefined4 *)(lVar11 + -4 + lVar12) =
           *(undefined4 *)((long)pcVar8->m_quantizedAabbMin + lVar12 + -4);
      *(undefined4 *)(lVar11 + lVar12) = *(undefined4 *)((long)pcVar8->m_quantizedAabbMin + lVar12);
      *(undefined8 *)(lVar11 + 4 + lVar12) = 0;
      *(undefined4 *)(lVar11 + 0xc + lVar12) = 0;
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar14 < this->m_subtreeHeaderCount);
  }
  cbtAlignedObjectArray<cbtBvhSubtreeInfo>::initializeFromBuffer
            ((cbtAlignedObjectArray<cbtBvhSubtreeInfo> *)((long)o_alignedDataBuffer + 0xd0),
             (void *)0x0,0,0);
  *(undefined8 *)o_alignedDataBuffer = 0;
  return true;
}

Assistant:

bool cbtQuantizedBvh::serialize(void* o_alignedDataBuffer, unsigned /*i_dataBufferSize */, bool i_swapEndian) const
{
	cbtAssert(m_subtreeHeaderCount == m_SubtreeHeaders.size());
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	/*	if (i_dataBufferSize < calculateSerializeBufferSize() || o_alignedDataBuffer == NULL || (((unsigned)o_alignedDataBuffer & BVH_ALIGNMENT_MASK) != 0))
	{
		///check alignedment for buffer?
		cbtAssert(0);
		return false;
	}
*/

	cbtQuantizedBvh* targetBvh = (cbtQuantizedBvh*)o_alignedDataBuffer;

	// construct the class so the virtual function table, etc will be set up
	// Also, m_leafNodes and m_quantizedLeafNodes will be initialized to default values by the constructor
	new (targetBvh) cbtQuantizedBvh;

	if (i_swapEndian)
	{
		targetBvh->m_curNodeIndex = static_cast<int>(cbtSwapEndian(m_curNodeIndex));

		cbtSwapVector3Endian(m_bvhAabbMin, targetBvh->m_bvhAabbMin);
		cbtSwapVector3Endian(m_bvhAabbMax, targetBvh->m_bvhAabbMax);
		cbtSwapVector3Endian(m_bvhQuantization, targetBvh->m_bvhQuantization);

		targetBvh->m_traversalMode = (cbtTraversalMode)cbtSwapEndian(m_traversalMode);
		targetBvh->m_subtreeHeaderCount = static_cast<int>(cbtSwapEndian(m_subtreeHeaderCount));
	}
	else
	{
		targetBvh->m_curNodeIndex = m_curNodeIndex;
		targetBvh->m_bvhAabbMin = m_bvhAabbMin;
		targetBvh->m_bvhAabbMax = m_bvhAabbMax;
		targetBvh->m_bvhQuantization = m_bvhQuantization;
		targetBvh->m_traversalMode = m_traversalMode;
		targetBvh->m_subtreeHeaderCount = m_subtreeHeaderCount;
	}

	targetBvh->m_useQuantization = m_useQuantization;

	unsigned char* nodeData = (unsigned char*)targetBvh;
	nodeData += sizeof(cbtQuantizedBvh);

	unsigned sizeToAdd = 0;  //(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	int nodeCount = m_curNodeIndex;

	if (m_useQuantization)
	{
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = static_cast<int>(cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex;
			}
		}
		nodeData += sizeof(cbtQuantizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}
	else
	{
		targetBvh->m_contiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				cbtSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMinOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg);
				cbtSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMaxOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg);

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_escapeIndex));
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_subPart));
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_triangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg = m_contiguousNodes[nodeIndex].m_aabbMinOrg;
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg = m_contiguousNodes[nodeIndex].m_aabbMaxOrg;

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = m_contiguousNodes[nodeIndex].m_escapeIndex;
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = m_contiguousNodes[nodeIndex].m_subPart;
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = m_contiguousNodes[nodeIndex].m_triangleIndex;
			}
		}
		nodeData += sizeof(cbtOptimizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_contiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}

	sizeToAdd = 0;  //(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	// Now serialize the subtree headers
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(nodeData, m_subtreeHeaderCount, m_subtreeHeaderCount);
	if (i_swapEndian)
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = static_cast<int>(cbtSwapEndian(m_SubtreeHeaders[i].m_rootNodeIndex));
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = static_cast<int>(cbtSwapEndian(m_SubtreeHeaders[i].m_subtreeSize));
		}
	}
	else
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = (m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = (m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = (m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = (m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = (m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = (m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = (m_SubtreeHeaders[i].m_rootNodeIndex);
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = (m_SubtreeHeaders[i].m_subtreeSize);

			// need to clear padding in destination buffer
			targetBvh->m_SubtreeHeaders[i].m_padding[0] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[1] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[2] = 0;
		}
	}
	nodeData += sizeof(cbtBvhSubtreeInfo) * m_subtreeHeaderCount;

	// this clears the pointer in the member variable it doesn't really do anything to the data
	// it does call the destructor on the contained objects, but they are all classes with no destructor defined
	// so the memory (which is not freed) is left alone
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(NULL, 0, 0);

	// this wipes the virtual function table pointer at the start of the buffer for the class
	*((void**)o_alignedDataBuffer) = NULL;

	return true;
}